

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O3

void aom_hadamard_16x16_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  tran_low_t *ptVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  
  lVar12 = 0;
  uVar10 = 0;
  ptVar11 = coeff;
  do {
    aom_hadamard_8x8_c(src_diff + (ulong)((uint)lVar12 & 8) * src_stride + (ulong)(uVar10 & 8),
                       src_stride,ptVar11);
    ptVar11 = ptVar11 + 0x40;
    uVar10 = uVar10 + 8;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0x10);
  lVar12 = -0x40;
  do {
    piVar3 = coeff + lVar12 + 0x40;
    piVar4 = coeff + lVar12 + 0x80;
    piVar5 = coeff + lVar12 + 0xc0;
    piVar6 = coeff + lVar12 + 0x100;
    iVar25 = *piVar4 + *piVar3 >> 1;
    iVar26 = piVar4[1] + piVar3[1] >> 1;
    iVar27 = piVar4[2] + piVar3[2] >> 1;
    iVar28 = piVar4[3] + piVar3[3] >> 1;
    iVar13 = *piVar3 - *piVar4 >> 1;
    iVar14 = piVar3[1] - piVar4[1] >> 1;
    iVar15 = piVar3[2] - piVar4[2] >> 1;
    iVar16 = piVar3[3] - piVar4[3] >> 1;
    iVar17 = *piVar6 + *piVar5 >> 1;
    iVar18 = piVar6[1] + piVar5[1] >> 1;
    iVar19 = piVar6[2] + piVar5[2] >> 1;
    iVar20 = piVar6[3] + piVar5[3] >> 1;
    iVar21 = *piVar5 - *piVar6 >> 1;
    iVar22 = piVar5[1] - piVar6[1] >> 1;
    iVar23 = piVar5[2] - piVar6[2] >> 1;
    iVar24 = piVar5[3] - piVar6[3] >> 1;
    ptVar11 = coeff + lVar12 + 0x40;
    *ptVar11 = iVar17 + iVar25;
    ptVar11[1] = iVar18 + iVar26;
    ptVar11[2] = iVar19 + iVar27;
    ptVar11[3] = iVar20 + iVar28;
    ptVar11 = coeff + lVar12 + 0x80;
    *ptVar11 = iVar21 + iVar13;
    ptVar11[1] = iVar22 + iVar14;
    ptVar11[2] = iVar23 + iVar15;
    ptVar11[3] = iVar24 + iVar16;
    ptVar11 = coeff + lVar12 + 0xc0;
    *ptVar11 = iVar25 - iVar17;
    ptVar11[1] = iVar26 - iVar18;
    ptVar11[2] = iVar27 - iVar19;
    ptVar11[3] = iVar28 - iVar20;
    ptVar11 = coeff + lVar12 + 0x100;
    *ptVar11 = iVar13 - iVar21;
    ptVar11[1] = iVar14 - iVar22;
    ptVar11[2] = iVar15 - iVar23;
    ptVar11[3] = iVar16 - iVar24;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 0);
  lVar12 = 0;
  do {
    puVar1 = (undefined8 *)((long)coeff + lVar12 + 0x10);
    uVar7 = *puVar1;
    uVar8 = puVar1[1];
    puVar1 = (undefined8 *)((long)coeff + lVar12 + 0x20);
    uVar9 = puVar1[1];
    puVar2 = (undefined8 *)((long)coeff + lVar12 + 0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar9;
    puVar1 = (undefined8 *)((long)coeff + lVar12 + 0x20);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    lVar12 = lVar12 + 0x40;
  } while (lVar12 != 0x400);
  return;
}

Assistant:

void aom_hadamard_16x16_c(const int16_t *src_diff, ptrdiff_t src_stride,
                          tran_low_t *coeff) {
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 9 bit, dynamic range [-255, 255]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_hadamard_8x8_c(src_ptr, src_stride, coeff + idx * 64);
  }

  // coeff: 15 bit, dynamic range [-16320, 16320]
  for (idx = 0; idx < 64; ++idx) {
    tran_low_t a0 = coeff[0];
    tran_low_t a1 = coeff[64];
    tran_low_t a2 = coeff[128];
    tran_low_t a3 = coeff[192];

    tran_low_t b0 = (a0 + a1) >> 1;  // (a0 + a1): 16 bit, [-32640, 32640]
    tran_low_t b1 = (a0 - a1) >> 1;  // b0-b3: 15 bit, dynamic range
    tran_low_t b2 = (a2 + a3) >> 1;  // [-16320, 16320]
    tran_low_t b3 = (a2 - a3) >> 1;

    coeff[0] = b0 + b2;  // 16 bit, [-32640, 32640]
    coeff[64] = b1 + b3;
    coeff[128] = b0 - b2;
    coeff[192] = b1 - b3;

    ++coeff;
  }

  coeff -= 64;
  // Extra shift to match AVX2 output (i.e., aom_hadamard_16x16_avx2).
  // Note that to match SSE2 output, it does not need this step.
  for (int i = 0; i < 16; i++) {
    for (int j = 0; j < 4; j++) {
      tran_low_t temp = coeff[i * 16 + 4 + j];
      coeff[i * 16 + 4 + j] = coeff[i * 16 + 8 + j];
      coeff[i * 16 + 8 + j] = temp;
    }
  }
}